

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathCmpNodes(xmlNodePtr node1,xmlNodePtr node2)

{
  xmlNodePtr pxVar1;
  bool bVar2;
  bool bVar3;
  intptr_t l2_1;
  intptr_t l1_1;
  intptr_t l2;
  intptr_t l1;
  xmlNodePtr root;
  xmlNodePtr cur;
  xmlNodePtr attrNode2;
  xmlNodePtr attrNode1;
  int attr2;
  int attr1;
  int depth2;
  int depth1;
  xmlNodePtr node2_local;
  xmlNodePtr node1_local;
  
  attrNode2 = (xmlNodePtr)0x0;
  cur = (xmlNodePtr)0x0;
  if ((node1 == (xmlNodePtr)0x0) || (node2 == (xmlNodePtr)0x0)) {
    node1_local._4_4_ = -2;
  }
  else if (node1 == node2) {
    node1_local._4_4_ = 0;
  }
  else {
    bVar2 = node1->type == XML_ATTRIBUTE_NODE;
    node2_local = node1;
    if (bVar2) {
      node2_local = node1->parent;
      attrNode2 = node1;
    }
    bVar3 = node2->type == XML_ATTRIBUTE_NODE;
    _depth2 = node2;
    if (bVar3) {
      _depth2 = node2->parent;
      cur = node2;
    }
    if (node2_local == _depth2) {
      if (bVar2 == bVar3) {
        if (bVar2) {
          for (root = cur->prev; root != (xmlNodePtr)0x0; root = root->prev) {
            if (root == attrNode2) {
              return 1;
            }
          }
          node1_local._4_4_ = -1;
        }
        else {
          node1_local._4_4_ = 0;
        }
      }
      else if (bVar3) {
        node1_local._4_4_ = 1;
      }
      else {
        node1_local._4_4_ = -1;
      }
    }
    else if ((node2_local->type == XML_NAMESPACE_DECL) || (_depth2->type == XML_NAMESPACE_DECL)) {
      node1_local._4_4_ = 1;
    }
    else if (node2_local == _depth2->prev) {
      node1_local._4_4_ = 1;
    }
    else if (node2_local == _depth2->next) {
      node1_local._4_4_ = -1;
    }
    else {
      if ((((node2_local->type == XML_ELEMENT_NODE) && (_depth2->type == XML_ELEMENT_NODE)) &&
          ((long)node2_local->content < 0)) &&
         (((long)_depth2->content < 0 && (node2_local->doc == _depth2->doc)))) {
        if (-(long)node2_local->content < -(long)_depth2->content) {
          return 1;
        }
        if (-(long)_depth2->content < -(long)node2_local->content) {
          return -1;
        }
      }
      attr2 = 0;
      for (root = _depth2; pxVar1 = root, root->parent != (_xmlNode *)0x0; root = root->parent) {
        if (root->parent == node2_local) {
          return 1;
        }
        attr2 = attr2 + 1;
      }
      attr1 = 0;
      for (root = node2_local; root->parent != (_xmlNode *)0x0; root = root->parent) {
        if (root->parent == _depth2) {
          return -1;
        }
        attr1 = attr1 + 1;
      }
      if (pxVar1 == root) {
        for (; attr2 < attr1; attr1 = attr1 + -1) {
          node2_local = node2_local->parent;
        }
        for (; attr1 < attr2; attr2 = attr2 + -1) {
          _depth2 = _depth2->parent;
        }
        do {
          if (node2_local->parent == _depth2->parent) {
            if (node2_local == _depth2->prev) {
              return 1;
            }
            if (node2_local == _depth2->next) {
              return -1;
            }
            if (((node2_local->type == XML_ELEMENT_NODE) && (_depth2->type == XML_ELEMENT_NODE)) &&
               (((long)node2_local->content < 0 &&
                (((long)_depth2->content < 0 && (node2_local->doc == _depth2->doc)))))) {
              if (-(long)node2_local->content < -(long)_depth2->content) {
                return 1;
              }
              if (-(long)_depth2->content < -(long)node2_local->content) {
                return -1;
              }
            }
            root = node2_local->next;
            while( true ) {
              if (root == (xmlNodePtr)0x0) {
                return -1;
              }
              if (root == _depth2) break;
              root = root->next;
            }
            return 1;
          }
          node2_local = node2_local->parent;
          _depth2 = _depth2->parent;
        } while ((node2_local != (_xmlNode *)0x0) && (_depth2 != (_xmlNode *)0x0));
        node1_local._4_4_ = -2;
      }
      else {
        node1_local._4_4_ = -2;
      }
    }
  }
  return node1_local._4_4_;
}

Assistant:

int
xmlXPathCmpNodes(xmlNodePtr node1, xmlNodePtr node2) {
    int depth1, depth2;
    int attr1 = 0, attr2 = 0;
    xmlNodePtr attrNode1 = NULL, attrNode2 = NULL;
    xmlNodePtr cur, root;

    if ((node1 == NULL) || (node2 == NULL))
	return(-2);
    /*
     * a couple of optimizations which will avoid computations in most cases
     */
    if (node1 == node2)		/* trivial case */
	return(0);
    if (node1->type == XML_ATTRIBUTE_NODE) {
	attr1 = 1;
	attrNode1 = node1;
	node1 = node1->parent;
    }
    if (node2->type == XML_ATTRIBUTE_NODE) {
	attr2 = 1;
	attrNode2 = node2;
	node2 = node2->parent;
    }
    if (node1 == node2) {
	if (attr1 == attr2) {
	    /* not required, but we keep attributes in order */
	    if (attr1 != 0) {
	        cur = attrNode2->prev;
		while (cur != NULL) {
		    if (cur == attrNode1)
		        return (1);
		    cur = cur->prev;
		}
		return (-1);
	    }
	    return(0);
	}
	if (attr2 == 1)
	    return(1);
	return(-1);
    }
    if ((node1->type == XML_NAMESPACE_DECL) ||
        (node2->type == XML_NAMESPACE_DECL))
	return(1);
    if (node1 == node2->prev)
	return(1);
    if (node1 == node2->next)
	return(-1);

    /*
     * Speedup using document order if available.
     */
    if ((node1->type == XML_ELEMENT_NODE) &&
	(node2->type == XML_ELEMENT_NODE) &&
	(0 > XML_NODE_SORT_VALUE(node1)) &&
	(0 > XML_NODE_SORT_VALUE(node2)) &&
	(node1->doc == node2->doc)) {
	XML_INTPTR_T l1, l2;

	l1 = -XML_NODE_SORT_VALUE(node1);
	l2 = -XML_NODE_SORT_VALUE(node2);
	if (l1 < l2)
	    return(1);
	if (l1 > l2)
	    return(-1);
    }

    /*
     * compute depth to root
     */
    for (depth2 = 0, cur = node2;cur->parent != NULL;cur = cur->parent) {
	if (cur->parent == node1)
	    return(1);
	depth2++;
    }
    root = cur;
    for (depth1 = 0, cur = node1;cur->parent != NULL;cur = cur->parent) {
	if (cur->parent == node2)
	    return(-1);
	depth1++;
    }
    /*
     * Distinct document (or distinct entities :-( ) case.
     */
    if (root != cur) {
	return(-2);
    }
    /*
     * get the nearest common ancestor.
     */
    while (depth1 > depth2) {
	depth1--;
	node1 = node1->parent;
    }
    while (depth2 > depth1) {
	depth2--;
	node2 = node2->parent;
    }
    while (node1->parent != node2->parent) {
	node1 = node1->parent;
	node2 = node2->parent;
	/* should not happen but just in case ... */
	if ((node1 == NULL) || (node2 == NULL))
	    return(-2);
    }
    /*
     * Find who's first.
     */
    if (node1 == node2->prev)
	return(1);
    if (node1 == node2->next)
	return(-1);
    /*
     * Speedup using document order if available.
     */
    if ((node1->type == XML_ELEMENT_NODE) &&
	(node2->type == XML_ELEMENT_NODE) &&
	(0 > XML_NODE_SORT_VALUE(node1)) &&
	(0 > XML_NODE_SORT_VALUE(node2)) &&
	(node1->doc == node2->doc)) {
	XML_INTPTR_T l1, l2;

	l1 = -XML_NODE_SORT_VALUE(node1);
	l2 = -XML_NODE_SORT_VALUE(node2);
	if (l1 < l2)
	    return(1);
	if (l1 > l2)
	    return(-1);
    }

    for (cur = node1->next;cur != NULL;cur = cur->next)
	if (cur == node2)
	    return(1);
    return(-1); /* assume there is no sibling list corruption */
}